

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_key.cpp
# Opt level: O1

void __thiscall
cfd::core::Privkey::Privkey(Privkey *this,ByteData *byte_data,NetType net_type,bool is_compressed)

{
  int iVar1;
  CfdException *this_00;
  bool bVar2;
  string local_60;
  CfdSourceLocation local_40;
  
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)this,&byte_data->data_);
  this->is_compressed_ = is_compressed;
  this->net_type_ = net_type;
  ByteData::GetBytes((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_60,&this->data_
                    );
  if (local_60._M_string_length - (long)local_60._M_dataplus._M_p == 0) {
    bVar2 = false;
  }
  else {
    iVar1 = wally_ec_private_key_verify
                      ((uchar *)local_60._M_dataplus._M_p,
                       local_60._M_string_length - (long)local_60._M_dataplus._M_p);
    bVar2 = iVar1 == 0;
  }
  if ((uchar *)local_60._M_dataplus._M_p != (uchar *)0x0) {
    operator_delete(local_60._M_dataplus._M_p,
                    local_60.field_2._M_allocated_capacity - (long)local_60._M_dataplus._M_p);
  }
  if (bVar2) {
    return;
  }
  local_40.filename = "cfdcore_key.cpp";
  local_40.line = 0x278;
  local_40.funcname = "Privkey";
  ByteData::GetHex_abi_cxx11_(&local_60,&this->data_);
  logger::log<std::__cxx11::string&>
            (&local_40,kCfdLogLevelWarning,"Invalid Privkey data. hex={}.",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Invalid Privkey data.","");
  CfdException::CfdException(this_00,kCfdIllegalArgumentError,&local_60);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

Privkey::Privkey(
    const ByteData &byte_data, NetType net_type, bool is_compressed)
    : data_(byte_data), is_compressed_(is_compressed), net_type_(net_type) {
  if (!IsValid(data_.GetBytes())) {
    warn(CFD_LOG_SOURCE, "Invalid Privkey data. hex={}.", data_.GetHex());
    throw CfdException(
        CfdError::kCfdIllegalArgumentError, "Invalid Privkey data.");
  }
}